

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval.h
# Opt level: O2

void __thiscall
embree::sse2::FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
          (FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,
          CatmullClarkPatch *patch,Vec2f *uv,float dscale,size_t depth,BezierCurve *border0,
          BezierCurve *border1,BezierCurve *border2,BezierCurve *border3)

{
  uint uVar1;
  vfloat_impl<4> *pvVar2;
  vfloat_impl<4> *pvVar3;
  vfloat_impl<4> *pvVar4;
  vfloat_impl<4> *pvVar5;
  vfloat_impl<4> *pvVar6;
  vfloat_impl<4> *pvVar7;
  anon_union_8_2_4062524c_for_Vec2<float>_1 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  ssize_t numCreases;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  bool bVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float fVar44;
  float fVar48;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar54;
  float fVar61;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar62;
  float fVar64;
  float fVar65;
  undefined1 auVar63 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL> patches;
  float local_3500;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3480;
  float local_3470;
  float fStack_346c;
  float fStack_3468;
  float fStack_3464;
  float local_3460;
  float fStack_345c;
  float fStack_3458;
  float fStack_3454;
  float local_3450;
  float fStack_344c;
  float fStack_3448;
  float fStack_3444;
  float local_3440;
  float fStack_343c;
  float fStack_3438;
  float fStack_3434;
  float local_3430;
  float fStack_342c;
  float fStack_3428;
  float fStack_3424;
  float local_3420;
  float fStack_341c;
  float fStack_3418;
  float fStack_3414;
  float local_3410;
  float fStack_340c;
  float fStack_3408;
  float fStack_3404;
  float local_3400;
  float fStack_33fc;
  float fStack_33f8;
  float fStack_33f4;
  float local_33f0;
  float fStack_33ec;
  float fStack_33e8;
  float fStack_33e4;
  float local_33e0;
  float fStack_33dc;
  float fStack_33d8;
  float fStack_33d4;
  float local_33d0;
  float fStack_33cc;
  float fStack_33c8;
  float fStack_33c4;
  float local_33c0;
  float fStack_33bc;
  float fStack_33b8;
  float fStack_33b4;
  float local_33b0;
  float fStack_33ac;
  float fStack_33a8;
  float fStack_33a4;
  float local_33a0;
  float fStack_339c;
  float fStack_3398;
  float fStack_3394;
  float local_3390;
  float fStack_338c;
  float fStack_3388;
  float fStack_3384;
  float local_3380;
  float fStack_337c;
  float fStack_3378;
  float fStack_3374;
  float local_3370;
  float fStack_336c;
  float fStack_3368;
  float fStack_3364;
  float local_3360;
  float fStack_335c;
  float fStack_3358;
  float fStack_3354;
  float local_3350;
  float fStack_334c;
  float fStack_3348;
  float fStack_3344;
  array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
  local_2780;
  array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
  local_1a80;
  array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
  local_d80;
  
  local_3500 = dscale;
  do {
    bVar19 = false;
    bVar15 = false;
    uVar1 = (patch->ring).items[0].face_valence;
    uVar23 = 0;
    for (uVar24 = 0; uVar1 != uVar24; uVar24 = uVar24 + 1) {
      uVar23 = uVar23 + (0.0 < (patch->ring).items[0].crease_weight.data[uVar24]);
    }
    iVar25 = (patch->ring).items[0].border_index;
    bVar26 = uVar23 == (uint)(iVar25 != -1) * 2;
    bVar17 = true;
    fVar28 = (patch->ring).items[0].vertex_crease_weight;
    bVar18 = bVar15;
    bVar22 = bVar19;
    if (uVar1 == 2 && iVar25 != -1) {
      if (((fVar28 == 0.0) && (!NAN(fVar28))) || (INFINITY <= fVar28)) goto LAB_005c8fff;
    }
    else if ((fVar28 == 0.0) && (!NAN(fVar28))) {
      if (uVar1 != 3 || iVar25 == -1) {
        bVar17 = uVar1 == 4 && iVar25 == -1;
        bVar26 = (uVar1 == 4 && iVar25 == -1) && bVar26;
      }
LAB_005c8fff:
      bVar18 = bVar26;
      bVar22 = bVar17;
    }
    uVar1 = (patch->ring).items[1].face_valence;
    uVar23 = 0;
    for (uVar24 = 0; uVar1 != uVar24; uVar24 = uVar24 + 1) {
      uVar23 = uVar23 + (0.0 < (patch->ring).items[1].crease_weight.data[uVar24]);
    }
    iVar25 = (patch->ring).items[1].border_index;
    bVar26 = uVar23 == (uint)(iVar25 != -1) * 2;
    bVar16 = true;
    fVar28 = (patch->ring).items[1].vertex_crease_weight;
    bVar17 = bVar15;
    bVar21 = bVar19;
    if (uVar1 == 2 && iVar25 != -1) {
      if (((fVar28 == 0.0) && (!NAN(fVar28))) || (INFINITY <= fVar28)) goto LAB_005c90a7;
    }
    else if ((fVar28 == 0.0) && (!NAN(fVar28))) {
      if (uVar1 != 3 || iVar25 == -1) {
        bVar16 = uVar1 == 4 && iVar25 == -1;
        bVar26 = (uVar1 == 4 && iVar25 == -1) && bVar26;
      }
LAB_005c90a7:
      bVar17 = bVar26;
      bVar21 = bVar16;
    }
    uVar1 = (patch->ring).items[2].face_valence;
    uVar23 = 0;
    for (uVar24 = 0; uVar1 != uVar24; uVar24 = uVar24 + 1) {
      uVar23 = uVar23 + (0.0 < (patch->ring).items[2].crease_weight.data[uVar24]);
    }
    iVar25 = (patch->ring).items[2].border_index;
    bVar26 = uVar23 == (uint)(iVar25 != -1) * 2;
    bVar27 = true;
    fVar28 = (patch->ring).items[2].vertex_crease_weight;
    bVar16 = bVar15;
    bVar20 = bVar19;
    if (uVar1 == 2 && iVar25 != -1) {
      if (((fVar28 == 0.0) && (!NAN(fVar28))) || (INFINITY <= fVar28)) goto LAB_005c9155;
    }
    else if ((fVar28 == 0.0) && (!NAN(fVar28))) {
      if (uVar1 != 3 || iVar25 == -1) {
        bVar27 = uVar1 == 4 && iVar25 == -1;
        bVar26 = (uVar1 == 4 && iVar25 == -1) && bVar26;
      }
LAB_005c9155:
      bVar16 = bVar26;
      bVar20 = bVar27;
    }
    uVar1 = (patch->ring).items[3].face_valence;
    uVar23 = 0;
    for (uVar24 = 0; uVar1 != uVar24; uVar24 = uVar24 + 1) {
      uVar23 = uVar23 + (0.0 < (patch->ring).items[3].crease_weight.data[uVar24]);
    }
    iVar25 = (patch->ring).items[3].border_index;
    bVar27 = uVar23 == (uint)(iVar25 != -1) * 2;
    bVar26 = true;
    fVar28 = (patch->ring).items[3].vertex_crease_weight;
    if (uVar1 == 2 && iVar25 != -1) {
      if (((fVar28 == 0.0) && (!NAN(fVar28))) || (INFINITY <= fVar28)) goto LAB_005c9207;
    }
    else if ((fVar28 == 0.0) && (!NAN(fVar28))) {
      if (uVar1 != 3 || iVar25 == -1) {
        bVar27 = (uVar1 == 4 && iVar25 == -1) && bVar27;
        bVar26 = uVar1 == 4 && iVar25 == -1;
      }
LAB_005c9207:
      bVar19 = bVar26;
      bVar15 = bVar27;
    }
    if (9 < depth) {
      if (!(bool)(bVar21 & bVar22 & bVar20 & bVar19)) {
        GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init_crackfix
                  ((GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
                   patch,border0,border1,border2,border3);
        fVar28 = (uv->field_0).field_0.x;
        fVar31 = (uv->field_0).field_0.y;
        pvVar2 = this->P;
        pvVar3 = this->dPdu;
        pvVar4 = this->dPdv;
        pvVar5 = this->ddPdudu;
        pvVar6 = this->ddPdvdv;
        pvVar7 = this->ddPdudv;
        if (pvVar2 != (vfloat_impl<4> *)0x0) {
          auVar35._4_4_ = -(uint)(fVar31 == 0.0);
          auVar35._0_4_ = -(uint)(fVar28 == 0.0);
          auVar35._8_4_ = -(uint)(fVar28 == 1.0);
          auVar35._12_4_ = -(uint)(fVar31 == 1.0);
          iVar25 = movmskps((int)border3,auVar35);
          fVar29 = local_3420;
          fVar44 = fStack_341c;
          fVar48 = fStack_3418;
          fVar33 = fStack_3414;
          fVar74 = local_33e0;
          fVar80 = fStack_33dc;
          fVar81 = fStack_33d8;
          fVar37 = fStack_33d4;
          fVar53 = local_33f0;
          fVar36 = fStack_33ec;
          fVar43 = fStack_33e8;
          fVar49 = fStack_33e4;
          fVar61 = local_3430;
          fVar64 = fStack_342c;
          fVar65 = fStack_3428;
          fVar54 = fStack_3424;
          if (iVar25 == 0) {
            fVar29 = fVar28 + fVar31;
            auVar34._4_4_ = fVar31;
            auVar34._0_4_ = fVar29;
            auVar34._8_8_ = 0;
            auVar9._4_4_ = fVar31;
            auVar9._0_4_ = fVar29;
            auVar9._8_8_ = 0;
            auVar35 = rcpss(auVar34,auVar9);
            fVar49 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
            fVar53 = 1.0 - fVar28;
            fVar61 = 1.0 - fVar31;
            fVar29 = fVar53 + fVar31;
            auVar63._4_4_ = fVar61;
            auVar63._0_4_ = fVar29;
            auVar63._8_8_ = 0;
            auVar10._4_4_ = fVar61;
            auVar10._0_4_ = fVar29;
            auVar10._8_8_ = 0;
            auVar35 = rcpss(auVar63,auVar10);
            fVar33 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
            fVar29 = (2.0 - fVar28) - fVar31;
            auVar35 = rcpss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
            fVar37 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
            fVar29 = (fVar28 + 1.0) - fVar31;
            auVar35 = rcpss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
            fVar43 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
            fVar29 = fVar33 * (local_3370 * fVar53 + local_3420 * fVar31);
            fVar44 = fVar33 * (fStack_336c * fVar53 + fStack_341c * fVar31);
            fVar48 = fVar33 * (fStack_3368 * fVar53 + fStack_3418 * fVar31);
            fVar33 = fVar33 * (fStack_3364 * fVar53 + fStack_3414 * fVar31);
            fVar74 = fVar37 * (local_3350 * fVar61 + fVar53 * local_33e0);
            fVar80 = fVar37 * (fStack_334c * fVar61 + fVar53 * fStack_33dc);
            fVar81 = fVar37 * (fStack_3348 * fVar61 + fVar53 * fStack_33d8);
            fVar37 = fVar37 * (fStack_3344 * fVar61 + fVar53 * fStack_33d4);
            fVar53 = fVar43 * (fVar61 * local_33f0 + local_3360 * fVar28);
            fVar36 = fVar43 * (fVar61 * fStack_33ec + fStack_335c * fVar28);
            fVar43 = fVar43 * (fVar61 * fStack_33e8 + fStack_3358 * fVar28);
            fVar49 = fVar43 * (fVar61 * fStack_33e4 + fStack_3354 * fVar28);
            fVar61 = fVar49 * (local_3380 * fVar31 + local_3430 * fVar28);
            fVar64 = fVar49 * (fStack_337c * fVar31 + fStack_342c * fVar28);
            fVar65 = fVar49 * (fStack_3378 * fVar31 + fStack_3428 * fVar28);
            fVar54 = fVar49 * (fStack_3374 * fVar31 + fStack_3424 * fVar28);
          }
          fVar32 = 1.0 - fVar31;
          fVar62 = 1.0 - fVar28;
          fVar66 = fVar28 * 3.0 * fVar62 * fVar62;
          fVar30 = fVar28 * fVar28 * 3.0 * fVar62;
          fVar69 = fVar31 * fVar31 * 3.0 * fVar32;
          fVar75 = fVar32 * fVar32 * fVar32;
          fVar32 = fVar31 * 3.0 * fVar32 * fVar32;
          fVar67 = fVar31 * fVar31 * fVar31;
          fVar62 = fVar62 * fVar62 * fVar62;
          fVar73 = fVar28 * fVar28 * fVar28;
          (pvVar2->field_0).v[0] =
               fVar67 * (fVar62 * local_33c0 +
                        fVar66 * local_33b0 + fVar30 * local_33a0 + fVar73 * local_3390) +
               (local_3400 * fVar62 + fVar53 * fVar66 + fVar74 * fVar30 + local_33d0 * fVar73) *
               fVar69 + (local_3440 * fVar62 +
                        fVar61 * fVar66 + fVar29 * fVar30 + local_3410 * fVar73) * fVar32 +
               (local_3480.v[0] * fVar62 +
               local_3470 * fVar66 + local_3460 * fVar30 + local_3450 * fVar73) * fVar75;
          (pvVar2->field_0).v[1] =
               fVar67 * (fVar62 * fStack_33bc +
                        fVar66 * fStack_33ac + fVar30 * fStack_339c + fVar73 * fStack_338c) +
               (fStack_33fc * fVar62 + fVar36 * fVar66 + fVar80 * fVar30 + fStack_33cc * fVar73) *
               fVar69 + (fStack_343c * fVar62 +
                        fVar64 * fVar66 + fVar44 * fVar30 + fStack_340c * fVar73) * fVar32 +
               (local_3480.v[1] * fVar62 +
               fStack_346c * fVar66 + fStack_345c * fVar30 + fStack_344c * fVar73) * fVar75;
          (pvVar2->field_0).v[2] =
               fVar67 * (fVar62 * fStack_33b8 +
                        fVar66 * fStack_33a8 + fVar30 * fStack_3398 + fVar73 * fStack_3388) +
               (fStack_33f8 * fVar62 + fVar43 * fVar66 + fVar81 * fVar30 + fStack_33c8 * fVar73) *
               fVar69 + (fStack_3438 * fVar62 +
                        fVar65 * fVar66 + fVar48 * fVar30 + fStack_3408 * fVar73) * fVar32 +
               (local_3480.v[2] * fVar62 +
               fStack_3468 * fVar66 + fStack_3458 * fVar30 + fStack_3448 * fVar73) * fVar75;
          (pvVar2->field_0).v[3] =
               fVar67 * (fVar62 * fStack_33b4 +
                        fVar66 * fStack_33a4 + fVar30 * fStack_3394 + fVar73 * fStack_3384) +
               (fStack_33f4 * fVar62 + fVar49 * fVar66 + fVar37 * fVar30 + fStack_33c4 * fVar73) *
               fVar69 + (fStack_3434 * fVar62 +
                        fVar54 * fVar66 + fVar33 * fVar30 + fStack_3404 * fVar73) * fVar32 +
               (local_3480.v[3] * fVar62 +
               fStack_3464 * fVar66 + fStack_3454 * fVar30 + fStack_3444 * fVar73) * fVar75;
        }
        if (pvVar3 != (vfloat_impl<4> *)0x0) {
          auVar11._4_4_ = -(uint)(fVar31 == 0.0);
          auVar11._0_4_ = -(uint)(fVar28 == 0.0);
          auVar11._8_4_ = -(uint)(fVar28 == 1.0);
          auVar11._12_4_ = -(uint)(fVar31 == 1.0);
          iVar25 = movmskps((int)pvVar2,auVar11);
          fVar29 = local_3420;
          fVar44 = fStack_341c;
          fVar48 = fStack_3418;
          fVar33 = fStack_3414;
          fVar74 = local_33e0;
          fVar80 = fStack_33dc;
          fVar81 = fStack_33d8;
          fVar37 = fStack_33d4;
          fVar53 = local_33f0;
          fVar36 = fStack_33ec;
          fVar43 = fStack_33e8;
          fVar49 = fStack_33e4;
          fVar61 = local_3430;
          fVar64 = fStack_342c;
          fVar65 = fStack_3428;
          fVar54 = fStack_3424;
          if (iVar25 == 0) {
            auVar38._0_4_ = fVar28 + fVar31;
            auVar38._4_4_ = fVar31;
            auVar38._8_8_ = 0;
            auVar51._4_4_ = fVar31;
            auVar51._0_4_ = auVar38._0_4_;
            auVar51._8_8_ = 0;
            auVar35 = rcpss(auVar51,auVar38);
            fVar44 = 1.0 - fVar28;
            fVar48 = 1.0 - fVar31;
            fVar80 = (2.0 - auVar38._0_4_ * auVar35._0_4_) * auVar35._0_4_;
            auVar52._0_4_ = fVar44 + fVar31;
            auVar52._4_4_ = fVar48;
            auVar52._8_8_ = 0;
            auVar55._4_4_ = fVar48;
            auVar55._0_4_ = auVar52._0_4_;
            auVar55._8_8_ = 0;
            auVar35 = rcpss(auVar55,auVar52);
            fVar33 = (2.0 - auVar52._0_4_ * auVar35._0_4_) * auVar35._0_4_;
            fVar29 = (2.0 - fVar28) - fVar31;
            auVar35 = rcpss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
            fVar74 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
            fVar29 = (fVar28 + 1.0) - fVar31;
            auVar35 = rcpss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
            fVar29 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
            fVar29 = fVar33 * (local_3370 * fVar44 + local_3420 * fVar31);
            fVar44 = fVar33 * (fStack_336c * fVar44 + fStack_341c * fVar31);
            fVar48 = fVar33 * (fStack_3368 * fVar44 + fStack_3418 * fVar31);
            fVar33 = fVar33 * (fStack_3364 * fVar44 + fStack_3414 * fVar31);
            fVar74 = fVar74 * (local_3350 * fVar48 + fVar44 * local_33e0);
            fVar80 = fVar74 * (fStack_334c * fVar48 + fVar44 * fStack_33dc);
            fVar81 = fVar74 * (fStack_3348 * fVar48 + fVar44 * fStack_33d8);
            fVar37 = fVar74 * (fStack_3344 * fVar48 + fVar44 * fStack_33d4);
            fVar53 = fVar29 * (fVar48 * local_33f0 + local_3360 * fVar28);
            fVar36 = fVar29 * (fVar48 * fStack_33ec + fStack_335c * fVar28);
            fVar43 = fVar29 * (fVar48 * fStack_33e8 + fStack_3358 * fVar28);
            fVar49 = fVar29 * (fVar48 * fStack_33e4 + fStack_3354 * fVar28);
            fVar61 = fVar80 * (local_3380 * fVar31 + local_3430 * fVar28);
            fVar64 = fVar80 * (fStack_337c * fVar31 + fStack_342c * fVar28);
            fVar65 = fVar80 * (fStack_3378 * fVar31 + fStack_3428 * fVar28);
            fVar54 = fVar80 * (fStack_3374 * fVar31 + fStack_3424 * fVar28);
          }
          fVar69 = 1.0 - fVar28;
          fVar73 = 1.0 - fVar31;
          fVar30 = fVar69 * fVar69;
          fVar32 = fVar28 * fVar69 + fVar28 * fVar69;
          fVar75 = fVar28 * fVar28;
          fVar70 = fVar30 * -3.0;
          fVar67 = (fVar30 - fVar32) * 3.0;
          fVar62 = (fVar32 - fVar75) * 3.0;
          fVar50 = fVar75 * 3.0;
          fVar76 = fVar73 * fVar73;
          fVar32 = fVar73 * fVar76;
          fVar82 = fVar31 * 3.0 * fVar76;
          fVar77 = fVar31 * fVar31;
          fVar68 = fVar77 * 3.0;
          fVar78 = fVar73 * fVar68;
          fVar66 = fVar31 * fVar77;
          (pvVar3->field_0).v[0] =
               (fVar66 * (fVar70 * local_33c0 +
                         fVar67 * local_33b0 + fVar62 * local_33a0 + fVar50 * local_3390) +
                (local_3400 * fVar70 + fVar53 * fVar67 + fVar74 * fVar62 + local_33d0 * fVar50) *
                fVar78 + (local_3440 * fVar70 +
                         fVar61 * fVar67 + fVar29 * fVar62 + local_3410 * fVar50) * fVar82 +
               (local_3480.v[0] * fVar70 +
               local_3470 * fVar67 + local_3460 * fVar62 + local_3450 * fVar50) * fVar32) *
               local_3500;
          (pvVar3->field_0).v[1] =
               (fVar66 * (fVar70 * fStack_33bc +
                         fVar67 * fStack_33ac + fVar62 * fStack_339c + fVar50 * fStack_338c) +
                (fStack_33fc * fVar70 + fVar36 * fVar67 + fVar80 * fVar62 + fStack_33cc * fVar50) *
                fVar78 + (fStack_343c * fVar70 +
                         fVar64 * fVar67 + fVar44 * fVar62 + fStack_340c * fVar50) * fVar82 +
               (local_3480.v[1] * fVar70 +
               fStack_346c * fVar67 + fStack_345c * fVar62 + fStack_344c * fVar50) * fVar32) *
               local_3500;
          (pvVar3->field_0).v[2] =
               (fVar66 * (fVar70 * fStack_33b8 +
                         fVar67 * fStack_33a8 + fVar62 * fStack_3398 + fVar50 * fStack_3388) +
                (fStack_33f8 * fVar70 + fVar43 * fVar67 + fVar81 * fVar62 + fStack_33c8 * fVar50) *
                fVar78 + (fStack_3438 * fVar70 +
                         fVar65 * fVar67 + fVar48 * fVar62 + fStack_3408 * fVar50) * fVar82 +
               (local_3480.v[2] * fVar70 +
               fStack_3468 * fVar67 + fStack_3458 * fVar62 + fStack_3448 * fVar50) * fVar32) *
               local_3500;
          (pvVar3->field_0).v[3] =
               (fVar66 * (fVar70 * fStack_33b4 +
                         fVar67 * fStack_33a4 + fVar62 * fStack_3394 + fVar50 * fStack_3384) +
                (fStack_33f4 * fVar70 + fVar49 * fVar67 + fVar37 * fVar62 + fStack_33c4 * fVar50) *
                fVar78 + (fStack_3434 * fVar70 +
                         fVar54 * fVar67 + fVar33 * fVar62 + fStack_3404 * fVar50) * fVar82 +
               (local_3480.v[3] * fVar70 +
               fStack_3464 * fVar67 + fStack_3454 * fVar62 + fStack_3444 * fVar50) * fVar32) *
               local_3500;
          fVar29 = local_33f0;
          fVar44 = fStack_33ec;
          fVar48 = fStack_33e8;
          fVar33 = fStack_33e4;
          fVar74 = local_33e0;
          fVar80 = fStack_33dc;
          fVar81 = fStack_33d8;
          fVar37 = fStack_33d4;
          fVar53 = local_3430;
          fVar36 = fStack_342c;
          fVar43 = fStack_3428;
          fVar49 = fStack_3424;
          fVar61 = local_3420;
          fVar64 = fStack_341c;
          fVar65 = fStack_3418;
          fVar54 = fStack_3414;
          if ((char)iVar25 == '\0') {
            auVar56._0_4_ = fVar28 + fVar31;
            auVar56._4_4_ = fVar31;
            auVar56._8_8_ = 0;
            auVar71._4_4_ = fVar31;
            auVar71._0_4_ = auVar56._0_4_;
            auVar71._8_8_ = 0;
            auVar35 = rcpss(auVar71,auVar56);
            fVar80 = (2.0 - auVar56._0_4_ * auVar35._0_4_) * auVar35._0_4_;
            auVar57._0_4_ = fVar69 + fVar31;
            auVar57._4_4_ = fVar73;
            auVar57._8_8_ = 0;
            auVar72._4_4_ = fVar73;
            auVar72._0_4_ = auVar57._0_4_;
            auVar72._8_8_ = 0;
            auVar35 = rcpss(auVar72,auVar57);
            fVar37 = (2.0 - auVar57._0_4_ * auVar35._0_4_) * auVar35._0_4_;
            fVar29 = (2.0 - fVar28) - fVar31;
            auVar35 = rcpss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
            fVar81 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
            fVar29 = (fVar28 + 1.0) - fVar31;
            auVar35 = rcpss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
            fVar33 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
            fVar29 = (local_33f0 * fVar73 + local_3360 * fVar28) * fVar33;
            fVar44 = (fStack_33ec * fVar73 + fStack_335c * fVar28) * fVar33;
            fVar48 = (fStack_33e8 * fVar73 + fStack_3358 * fVar28) * fVar33;
            fVar33 = (fStack_33e4 * fVar73 + fStack_3354 * fVar28) * fVar33;
            fVar74 = fVar81 * (local_3350 * fVar73 + fVar69 * local_33e0);
            fVar80 = fVar81 * (fStack_334c * fVar73 + fVar69 * fStack_33dc);
            fVar81 = fVar81 * (fStack_3348 * fVar73 + fVar69 * fStack_33d8);
            fVar37 = fVar81 * (fStack_3344 * fVar73 + fVar69 * fStack_33d4);
            fVar53 = fVar80 * (local_3380 * fVar31 + local_3430 * fVar28);
            fVar36 = fVar80 * (fStack_337c * fVar31 + fStack_342c * fVar28);
            fVar43 = fVar80 * (fStack_3378 * fVar31 + fStack_3428 * fVar28);
            fVar49 = fVar80 * (fStack_3374 * fVar31 + fStack_3424 * fVar28);
            fVar61 = (local_3420 * fVar31 + local_3370 * fVar69) * fVar37;
            fVar64 = (fStack_341c * fVar31 + fStack_336c * fVar69) * fVar37;
            fVar65 = (fStack_3418 * fVar31 + fStack_3368 * fVar69) * fVar37;
            fVar54 = (fStack_3414 * fVar31 + fStack_3364 * fVar69) * fVar37;
          }
          fVar66 = fVar31 * fVar73 + fVar31 * fVar73;
          fVar32 = fVar28 * 3.0 * fVar30;
          fVar50 = fVar50 * fVar69;
          fVar62 = (fVar76 - fVar66) * 3.0;
          fVar66 = (fVar66 - fVar77) * 3.0;
          fVar69 = fVar69 * fVar30;
          fVar75 = fVar75 * fVar28;
          fVar76 = fVar76 * -3.0;
          (pvVar4->field_0).v[0] =
               local_3500 *
               (fVar68 * (fVar69 * local_33c0 +
                         fVar32 * local_33b0 + fVar50 * local_33a0 + fVar75 * local_3390) +
                (local_3400 * fVar69 + fVar29 * fVar32 + fVar74 * fVar50 + local_33d0 * fVar75) *
                fVar66 + (local_3440 * fVar69 +
                         fVar53 * fVar32 + fVar61 * fVar50 + local_3410 * fVar75) * fVar62 +
               (local_3480.v[0] * fVar69 +
               local_3470 * fVar32 + local_3460 * fVar50 + local_3450 * fVar75) * fVar76);
          (pvVar4->field_0).v[1] =
               local_3500 *
               (fVar68 * (fVar69 * fStack_33bc +
                         fVar32 * fStack_33ac + fVar50 * fStack_339c + fVar75 * fStack_338c) +
                (fStack_33fc * fVar69 + fVar44 * fVar32 + fVar80 * fVar50 + fStack_33cc * fVar75) *
                fVar66 + (fStack_343c * fVar69 +
                         fVar36 * fVar32 + fVar64 * fVar50 + fStack_340c * fVar75) * fVar62 +
               (local_3480.v[1] * fVar69 +
               fStack_346c * fVar32 + fStack_345c * fVar50 + fStack_344c * fVar75) * fVar76);
          (pvVar4->field_0).v[2] =
               local_3500 *
               (fVar68 * (fVar69 * fStack_33b8 +
                         fVar32 * fStack_33a8 + fVar50 * fStack_3398 + fVar75 * fStack_3388) +
                (fStack_33f8 * fVar69 + fVar48 * fVar32 + fVar81 * fVar50 + fStack_33c8 * fVar75) *
                fVar66 + (fStack_3438 * fVar69 +
                         fVar43 * fVar32 + fVar65 * fVar50 + fStack_3408 * fVar75) * fVar62 +
               (local_3480.v[2] * fVar69 +
               fStack_3468 * fVar32 + fStack_3458 * fVar50 + fStack_3448 * fVar75) * fVar76);
          (pvVar4->field_0).v[3] =
               local_3500 *
               (fVar68 * (fVar69 * fStack_33b4 +
                         fVar32 * fStack_33a4 + fVar50 * fStack_3394 + fVar75 * fStack_3384) +
                (fStack_33f4 * fVar69 + fVar33 * fVar32 + fVar37 * fVar50 + fStack_33c4 * fVar75) *
                fVar66 + (fStack_3434 * fVar69 +
                         fVar49 * fVar32 + fVar54 * fVar50 + fStack_3404 * fVar75) * fVar62 +
               (local_3480.v[3] * fVar69 +
               fStack_3464 * fVar32 + fStack_3454 * fVar50 + fStack_3444 * fVar75) * fVar76);
        }
        if (pvVar5 == (vfloat_impl<4> *)0x0) {
          return;
        }
        auVar12._4_4_ = -(uint)(fVar31 == 0.0);
        auVar12._0_4_ = -(uint)(fVar28 == 0.0);
        auVar12._8_4_ = -(uint)(fVar28 == 1.0);
        auVar12._12_4_ = -(uint)(fVar31 == 1.0);
        iVar25 = movmskps((int)pvVar4,auVar12);
        fVar29 = local_33f0;
        fVar44 = fStack_33ec;
        fVar48 = fStack_33e8;
        fVar33 = fStack_33e4;
        fVar74 = local_3430;
        fVar80 = fStack_342c;
        fVar81 = fStack_3428;
        fVar37 = fStack_3424;
        fVar53 = local_3420;
        fVar36 = fStack_341c;
        fVar43 = fStack_3418;
        fVar49 = fStack_3414;
        fVar61 = local_33e0;
        fVar64 = fStack_33dc;
        fVar65 = fStack_33d8;
        fVar54 = fStack_33d4;
        if (iVar25 == 0) {
          auVar45._0_4_ = fVar28 + fVar31;
          auVar45._4_4_ = fVar31;
          auVar45._8_8_ = 0;
          auVar58._4_4_ = fVar31;
          auVar58._0_4_ = auVar45._0_4_;
          auVar58._8_8_ = 0;
          auVar35 = rcpss(auVar58,auVar45);
          fVar74 = 1.0 - fVar28;
          fVar80 = 1.0 - fVar31;
          fVar44 = (2.0 - auVar45._0_4_ * auVar35._0_4_) * auVar35._0_4_;
          auVar46._0_4_ = fVar74 + fVar31;
          auVar46._4_4_ = fVar80;
          auVar46._8_8_ = 0;
          auVar59._4_4_ = fVar80;
          auVar59._0_4_ = auVar46._0_4_;
          auVar59._8_8_ = 0;
          auVar35 = rcpss(auVar59,auVar46);
          fVar48 = (2.0 - auVar46._0_4_ * auVar35._0_4_) * auVar35._0_4_;
          fVar29 = (2.0 - fVar28) - fVar31;
          auVar35 = rcpss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
          fVar33 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
          fVar29 = (fVar28 + 1.0) - fVar31;
          auVar35 = rcpss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
          fVar29 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
          fVar29 = fVar29 * (fVar80 * local_33f0 + local_3360 * fVar28);
          fVar44 = fVar29 * (fVar80 * fStack_33ec + fStack_335c * fVar28);
          fVar48 = fVar29 * (fVar80 * fStack_33e8 + fStack_3358 * fVar28);
          fVar33 = fVar29 * (fVar80 * fStack_33e4 + fStack_3354 * fVar28);
          fVar74 = fVar44 * (local_3380 * fVar31 + local_3430 * fVar28);
          fVar80 = fVar44 * (fStack_337c * fVar31 + fStack_342c * fVar28);
          fVar81 = fVar44 * (fStack_3378 * fVar31 + fStack_3428 * fVar28);
          fVar37 = fVar44 * (fStack_3374 * fVar31 + fStack_3424 * fVar28);
          fVar53 = (local_3420 * fVar31 + local_3370 * fVar74) * fVar48;
          fVar36 = (fStack_341c * fVar31 + fStack_336c * fVar74) * fVar48;
          fVar43 = (fStack_3418 * fVar31 + fStack_3368 * fVar74) * fVar48;
          fVar49 = (fStack_3414 * fVar31 + fStack_3364 * fVar74) * fVar48;
          fVar61 = fVar33 * (local_3350 * fVar80 + fVar74 * local_33e0);
          fVar64 = fVar33 * (fStack_334c * fVar80 + fVar74 * fStack_33dc);
          fVar65 = fVar33 * (fStack_3348 * fVar80 + fVar74 * fStack_33d8);
          fVar54 = fVar33 * (fStack_3344 * fVar80 + fVar74 * fStack_33d4);
        }
        fVar70 = 1.0 - fVar31;
        fVar76 = 1.0 - fVar28;
        fVar68 = fVar76 * 6.0;
        fVar75 = (fVar28 - (fVar76 + fVar76)) * 6.0;
        fVar77 = (fVar76 - (fVar28 + fVar28)) * 6.0;
        fVar30 = fVar28 * 6.0;
        fVar66 = fVar70 * fVar70;
        fVar62 = fVar70 * fVar66;
        fVar69 = fVar31 * 3.0 * fVar66;
        fVar50 = fVar31 * fVar31;
        fVar67 = fVar50 * 3.0;
        fVar73 = fVar70 * fVar67;
        fVar32 = fVar31 * fVar50;
        local_3500 = local_3500 * local_3500;
        (pvVar5->field_0).v[0] =
             (fVar32 * (fVar68 * local_33c0 +
                       fVar75 * local_33b0 + fVar77 * local_33a0 + fVar30 * local_3390) +
              (local_3400 * fVar68 + fVar29 * fVar75 + fVar61 * fVar77 + local_33d0 * fVar30) *
              fVar73 + (local_3440 * fVar68 +
                       fVar74 * fVar75 + fVar53 * fVar77 + local_3410 * fVar30) * fVar69 +
             (local_3480.v[0] * fVar68 +
             local_3470 * fVar75 + local_3460 * fVar77 + local_3450 * fVar30) * fVar62) * local_3500
        ;
        (pvVar5->field_0).v[1] =
             (fVar32 * (fVar68 * fStack_33bc +
                       fVar75 * fStack_33ac + fVar77 * fStack_339c + fVar30 * fStack_338c) +
              (fStack_33fc * fVar68 + fVar44 * fVar75 + fVar64 * fVar77 + fStack_33cc * fVar30) *
              fVar73 + (fStack_343c * fVar68 +
                       fVar80 * fVar75 + fVar36 * fVar77 + fStack_340c * fVar30) * fVar69 +
             (local_3480.v[1] * fVar68 +
             fStack_346c * fVar75 + fStack_345c * fVar77 + fStack_344c * fVar30) * fVar62) *
             local_3500;
        (pvVar5->field_0).v[2] =
             (fVar32 * (fVar68 * fStack_33b8 +
                       fVar75 * fStack_33a8 + fVar77 * fStack_3398 + fVar30 * fStack_3388) +
              (fStack_33f8 * fVar68 + fVar48 * fVar75 + fVar65 * fVar77 + fStack_33c8 * fVar30) *
              fVar73 + (fStack_3438 * fVar68 +
                       fVar81 * fVar75 + fVar43 * fVar77 + fStack_3408 * fVar30) * fVar69 +
             (local_3480.v[2] * fVar68 +
             fStack_3468 * fVar75 + fStack_3458 * fVar77 + fStack_3448 * fVar30) * fVar62) *
             local_3500;
        (pvVar5->field_0).v[3] =
             (fVar32 * (fVar68 * fStack_33b4 +
                       fVar75 * fStack_33a4 + fVar77 * fStack_3394 + fVar30 * fStack_3384) +
              (fStack_33f4 * fVar68 + fVar33 * fVar75 + fVar54 * fVar77 + fStack_33c4 * fVar30) *
              fVar73 + (fStack_3434 * fVar68 +
                       fVar37 * fVar75 + fVar49 * fVar77 + fStack_3404 * fVar30) * fVar69 +
             (local_3480.v[3] * fVar68 +
             fStack_3464 * fVar75 + fStack_3454 * fVar77 + fStack_3444 * fVar30) * fVar62) *
             local_3500;
        fVar29 = local_33f0;
        fVar44 = fStack_33ec;
        fVar48 = fStack_33e8;
        fVar33 = fStack_33e4;
        fVar74 = local_33e0;
        fVar80 = fStack_33dc;
        fVar81 = fStack_33d8;
        fVar37 = fStack_33d4;
        fVar53 = local_3430;
        fVar36 = fStack_342c;
        fVar43 = fStack_3428;
        fVar49 = fStack_3424;
        fVar61 = local_3420;
        fVar64 = fStack_341c;
        fVar65 = fStack_3418;
        fVar54 = fStack_3414;
        if ((char)iVar25 == '\0') {
          auVar39._0_4_ = fVar28 + fVar31;
          auVar39._4_4_ = fVar31;
          auVar39._8_8_ = 0;
          auVar60._4_4_ = fVar31;
          auVar60._0_4_ = auVar39._0_4_;
          auVar60._8_8_ = 0;
          auVar35 = rcpss(auVar60,auVar39);
          fVar49 = (2.0 - auVar39._0_4_ * auVar35._0_4_) * auVar35._0_4_;
          fVar53 = fVar49 * (local_3380 * fVar31 + local_3430 * fVar28);
          fVar36 = fVar49 * (fStack_337c * fVar31 + fStack_342c * fVar28);
          fVar43 = fVar49 * (fStack_3378 * fVar31 + fStack_3428 * fVar28);
          fVar49 = fVar49 * (fStack_3374 * fVar31 + fStack_3424 * fVar28);
          fVar29 = fVar76 + fVar31;
          auVar40._4_4_ = fVar70;
          auVar40._0_4_ = fVar29;
          auVar40._8_8_ = 0;
          auVar13._4_4_ = fVar70;
          auVar13._0_4_ = fVar29;
          auVar13._8_8_ = 0;
          auVar35 = rcpss(auVar40,auVar13);
          fVar54 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
          fVar61 = (local_3420 * fVar31 + local_3370 * fVar76) * fVar54;
          fVar64 = (fStack_341c * fVar31 + fStack_336c * fVar76) * fVar54;
          fVar65 = (fStack_3418 * fVar31 + fStack_3368 * fVar76) * fVar54;
          fVar54 = (fStack_3414 * fVar31 + fStack_3364 * fVar76) * fVar54;
          fVar29 = (2.0 - fVar28) - fVar31;
          auVar35 = rcpss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
          fVar37 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
          fVar74 = fVar37 * (local_3350 * fVar70 + local_33e0 * fVar76);
          fVar80 = fVar37 * (fStack_334c * fVar70 + fStack_33dc * fVar76);
          fVar81 = fVar37 * (fStack_3348 * fVar70 + fStack_33d8 * fVar76);
          fVar37 = fVar37 * (fStack_3344 * fVar70 + fStack_33d4 * fVar76);
          fVar29 = (fVar28 + 1.0) - fVar31;
          auVar35 = rcpss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
          fVar33 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
          fVar29 = (local_33f0 * fVar70 + local_3360 * fVar28) * fVar33;
          fVar44 = (fStack_33ec * fVar70 + fStack_335c * fVar28) * fVar33;
          fVar48 = (fStack_33e8 * fVar70 + fStack_3358 * fVar28) * fVar33;
          fVar33 = (fStack_33e4 * fVar70 + fStack_3354 * fVar28) * fVar33;
        }
        fVar78 = fVar76 * fVar76;
        fVar30 = fVar28 * 3.0 * fVar78;
        fVar82 = fVar28 * fVar28;
        fVar69 = fVar82 * 3.0;
        fVar62 = fVar76 * fVar69;
        fVar68 = fVar76 * fVar78;
        fVar79 = fVar28 * fVar82;
        fVar73 = fVar70 * 6.0;
        fVar32 = (fVar31 - (fVar70 + fVar70)) * 6.0;
        fVar75 = (fVar70 - (fVar31 + fVar31)) * 6.0;
        fVar77 = fVar31 * 6.0;
        (pvVar6->field_0).v[0] =
             (fVar77 * (fVar68 * local_33c0 +
                       fVar30 * local_33b0 + fVar62 * local_33a0 + fVar79 * local_3390) +
              (local_3400 * fVar68 + fVar29 * fVar30 + fVar74 * fVar62 + local_33d0 * fVar79) *
              fVar75 + (local_3440 * fVar68 +
                       fVar53 * fVar30 + fVar61 * fVar62 + local_3410 * fVar79) * fVar32 +
             (local_3480.v[0] * fVar68 +
             local_3470 * fVar30 + local_3460 * fVar62 + local_3450 * fVar79) * fVar73) * local_3500
        ;
        (pvVar6->field_0).v[1] =
             (fVar77 * (fVar68 * fStack_33bc +
                       fVar30 * fStack_33ac + fVar62 * fStack_339c + fVar79 * fStack_338c) +
              (fStack_33fc * fVar68 + fVar44 * fVar30 + fVar80 * fVar62 + fStack_33cc * fVar79) *
              fVar75 + (fStack_343c * fVar68 +
                       fVar36 * fVar30 + fVar64 * fVar62 + fStack_340c * fVar79) * fVar32 +
             (local_3480.v[1] * fVar68 +
             fStack_346c * fVar30 + fStack_345c * fVar62 + fStack_344c * fVar79) * fVar73) *
             local_3500;
        (pvVar6->field_0).v[2] =
             (fVar77 * (fVar68 * fStack_33b8 +
                       fVar30 * fStack_33a8 + fVar62 * fStack_3398 + fVar79 * fStack_3388) +
              (fStack_33f8 * fVar68 + fVar48 * fVar30 + fVar81 * fVar62 + fStack_33c8 * fVar79) *
              fVar75 + (fStack_3438 * fVar68 +
                       fVar43 * fVar30 + fVar65 * fVar62 + fStack_3408 * fVar79) * fVar32 +
             (local_3480.v[2] * fVar68 +
             fStack_3468 * fVar30 + fStack_3458 * fVar62 + fStack_3448 * fVar79) * fVar73) *
             local_3500;
        (pvVar6->field_0).v[3] =
             (fVar77 * (fVar68 * fStack_33b4 +
                       fVar30 * fStack_33a4 + fVar62 * fStack_3394 + fVar79 * fStack_3384) +
              (fStack_33f4 * fVar68 + fVar33 * fVar30 + fVar37 * fVar62 + fStack_33c4 * fVar79) *
              fVar75 + (fStack_3434 * fVar68 +
                       fVar49 * fVar30 + fVar54 * fVar62 + fStack_3404 * fVar79) * fVar32 +
             (local_3480.v[3] * fVar68 +
             fStack_3464 * fVar30 + fStack_3454 * fVar62 + fStack_3444 * fVar79) * fVar73) *
             local_3500;
        if ((char)iVar25 == '\0') {
          auVar41._0_4_ = fVar28 + fVar31;
          auVar41._4_4_ = fVar31;
          auVar41._8_8_ = 0;
          auVar47._4_4_ = fVar31;
          auVar47._0_4_ = auVar41._0_4_;
          auVar47._8_8_ = 0;
          auVar35 = rcpss(auVar47,auVar41);
          fVar29 = (2.0 - auVar41._0_4_ * auVar35._0_4_) * auVar35._0_4_;
          local_3430 = fVar29 * (local_3380 * fVar31 + local_3430 * fVar28);
          fStack_342c = fVar29 * (fStack_337c * fVar31 + fStack_342c * fVar28);
          fStack_3428 = fVar29 * (fStack_3378 * fVar31 + fStack_3428 * fVar28);
          fStack_3424 = fVar29 * (fStack_3374 * fVar31 + fStack_3424 * fVar28);
          fVar29 = fVar76 + fVar31;
          auVar42._4_4_ = fVar70;
          auVar42._0_4_ = fVar29;
          auVar42._8_8_ = 0;
          auVar14._4_4_ = fVar70;
          auVar14._0_4_ = fVar29;
          auVar14._8_8_ = 0;
          auVar35 = rcpss(auVar42,auVar14);
          fVar29 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
          local_3420 = (local_3420 * fVar31 + local_3370 * fVar76) * fVar29;
          fStack_341c = (fStack_341c * fVar31 + fStack_336c * fVar76) * fVar29;
          fStack_3418 = (fStack_3418 * fVar31 + fStack_3368 * fVar76) * fVar29;
          fStack_3414 = (fStack_3414 * fVar31 + fStack_3364 * fVar76) * fVar29;
          fVar29 = (2.0 - fVar28) - fVar31;
          auVar35 = rcpss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
          fVar29 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
          local_33e0 = fVar29 * (local_3350 * fVar70 + local_33e0 * fVar76);
          fStack_33dc = fVar29 * (fStack_334c * fVar70 + fStack_33dc * fVar76);
          fStack_33d8 = fVar29 * (fStack_3348 * fVar70 + fStack_33d8 * fVar76);
          fStack_33d4 = fVar29 * (fStack_3344 * fVar70 + fStack_33d4 * fVar76);
          fVar29 = (fVar28 + 1.0) - fVar31;
          auVar35 = rcpss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
          fVar29 = (2.0 - fVar29 * auVar35._0_4_) * auVar35._0_4_;
          local_33f0 = (local_33f0 * fVar70 + fVar28 * local_3360) * fVar29;
          fStack_33ec = (fStack_33ec * fVar70 + fVar28 * fStack_335c) * fVar29;
          fStack_33e8 = (fStack_33e8 * fVar70 + fVar28 * fStack_3358) * fVar29;
          fStack_33e4 = (fStack_33e4 * fVar70 + fVar28 * fStack_3354) * fVar29;
        }
        fVar29 = fVar28 * fVar76 + fVar28 * fVar76;
        fVar48 = fVar78 * -3.0;
        fVar28 = (fVar78 - fVar29) * 3.0;
        fVar29 = (fVar29 - fVar82) * 3.0;
        fVar33 = fVar31 * fVar70 + fVar31 * fVar70;
        fVar44 = fVar66 * -3.0;
        fVar31 = (fVar66 - fVar33) * 3.0;
        fVar33 = (fVar33 - fVar50) * 3.0;
        (pvVar7->field_0).v[0] =
             local_3500 *
             (fVar67 * (fVar48 * local_33c0 +
                       fVar28 * local_33b0 + fVar29 * local_33a0 + fVar69 * local_3390) +
              (local_3400 * fVar48 + local_33f0 * fVar28 + local_33e0 * fVar29 + local_33d0 * fVar69
              ) * fVar33 +
              (local_3440 * fVar48 + local_3430 * fVar28 + local_3420 * fVar29 + local_3410 * fVar69
              ) * fVar31 +
             (local_3480.v[0] * fVar48 +
             local_3470 * fVar28 + local_3460 * fVar29 + local_3450 * fVar69) * fVar44);
        (pvVar7->field_0).v[1] =
             local_3500 *
             (fVar67 * (fVar48 * fStack_33bc +
                       fVar28 * fStack_33ac + fVar29 * fStack_339c + fVar69 * fStack_338c) +
              (fStack_33fc * fVar48 +
              fStack_33ec * fVar28 + fStack_33dc * fVar29 + fStack_33cc * fVar69) * fVar33 +
              (fStack_343c * fVar48 +
              fStack_342c * fVar28 + fStack_341c * fVar29 + fStack_340c * fVar69) * fVar31 +
             (local_3480.v[1] * fVar48 +
             fStack_346c * fVar28 + fStack_345c * fVar29 + fStack_344c * fVar69) * fVar44);
        (pvVar7->field_0).v[2] =
             local_3500 *
             (fVar67 * (fVar48 * fStack_33b8 +
                       fVar28 * fStack_33a8 + fVar29 * fStack_3398 + fVar69 * fStack_3388) +
              (fStack_33f8 * fVar48 +
              fStack_33e8 * fVar28 + fStack_33d8 * fVar29 + fStack_33c8 * fVar69) * fVar33 +
              (fStack_3438 * fVar48 +
              fStack_3428 * fVar28 + fStack_3418 * fVar29 + fStack_3408 * fVar69) * fVar31 +
             (local_3480.v[2] * fVar48 +
             fStack_3468 * fVar28 + fStack_3458 * fVar29 + fStack_3448 * fVar69) * fVar44);
        (pvVar7->field_0).v[3] =
             local_3500 *
             (fVar67 * (fVar48 * fStack_33b4 +
                       fVar28 * fStack_33a4 + fVar29 * fStack_3394 + fVar69 * fStack_3384) +
              (fStack_33f4 * fVar48 +
              fStack_33e4 * fVar28 + fStack_33d4 * fVar29 + fStack_33c4 * fVar69) * fVar33 +
              (fStack_3434 * fVar48 +
              fStack_3424 * fVar28 + fStack_3414 * fVar29 + fStack_3404 * fVar69) * fVar31 +
             (local_3480.v[3] * fVar48 +
             fStack_3464 * fVar28 + fStack_3454 * fVar29 + fStack_3444 * fVar69) * fVar44);
        return;
      }
LAB_005ca5ca:
      BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init
                ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
                 (EVP_PKEY_CTX *)patch);
      BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
                ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
                 (uv->field_0).field_0.x,(uv->field_0).field_0.y,this->P,this->dPdu,this->dPdv,
                 this->ddPdudu,this->ddPdvdv,this->ddPdudv,local_3500);
      return;
    }
    if ((bool)(bVar17 & bVar18 & bVar16 & bVar15)) goto LAB_005ca5ca;
    array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
    array_t((array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
             *)&local_3480);
    CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::subdivide
              (patch,(array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
                      *)&local_3480);
    fVar28 = (uv->field_0).field_0.x;
    fVar31 = (uv->field_0).field_0.y;
    if (0.5 <= fVar31) {
      if (fVar28 <= 0.5) {
        array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
        operator=(&patch->ring,&local_d80);
        fVar28 = fVar28 + fVar28;
        fVar31 = fVar31 + fVar31 + -1.0;
      }
      else {
        array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
        operator=(&patch->ring,&local_1a80);
        fVar28 = fVar28 + fVar28 + -1.0;
        fVar31 = fVar31 + fVar31 + -1.0;
      }
    }
    else if (0.5 <= fVar28) {
      array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
      operator=(&patch->ring,&local_2780);
      fVar28 = fVar28 + fVar28 + -1.0;
      fVar31 = fVar31 + fVar31;
    }
    else {
      array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
      operator=(&patch->ring,
                (array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
                 *)&local_3480);
      fVar28 = fVar28 + fVar28;
      fVar31 = fVar31 + fVar31;
    }
    aVar8.field_0.y = fVar31;
    aVar8.field_0.x = fVar28;
    uv->field_0 = aVar8;
    local_3500 = local_3500 + local_3500;
    depth = depth + 1;
    array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
    ~array_t((array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
              *)&local_3480);
  } while( true );
}

Assistant:

void eval(CatmullClarkPatch& patch, Vec2f uv, float dscale, size_t depth, 
                  BezierCurve* border0 = nullptr, BezierCurve* border1 = nullptr, BezierCurve* border2 = nullptr, BezierCurve* border3 = nullptr)
        {
          while (true) 
          {
            typename CatmullClarkPatch::Type ty = patch.type();

            if (unlikely(final(patch,ty,depth)))
            {
              if (ty & CatmullClarkRing::TYPE_REGULAR) { 
                RegularPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
                PATCH_DEBUG_SUBDIVISION(234423,c,c,-1);
                return;
              } else {
                IrregularFillPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
                PATCH_DEBUG_SUBDIVISION(34534,c,-1,c);
                return;
              }
            }
            else if (ty & CatmullClarkRing::TYPE_REGULAR_CREASES) { 
              assert(depth > 0); 
              RegularPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
              PATCH_DEBUG_SUBDIVISION(43524,c,c,-1);
              return;
            }
#if PATCH_USE_GREGORY == 2
            else if (ty & CatmullClarkRing::TYPE_GREGORY_CREASES) { 
              assert(depth > 0); 
              GregoryPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
              PATCH_DEBUG_SUBDIVISION(23498,c,-1,c);
              return;
            }
#endif
            else
            {
              array_t<CatmullClarkPatch,4> patches; 
              patch.subdivide(patches); // FIXME: only have to generate one of the patches
              
              const float u = uv.x, v = uv.y;
              if (v < 0.5f) {
                if (u < 0.5f) { patch = patches[0]; uv = Vec2f(2.0f*u,2.0f*v); dscale *= 2.0f; }
                else          { patch = patches[1]; uv = Vec2f(2.0f*u-1.0f,2.0f*v); dscale *= 2.0f; }
              } else {
                if (u > 0.5f) { patch = patches[2]; uv = Vec2f(2.0f*u-1.0f,2.0f*v-1.0f); dscale *= 2.0f; }
                else          { patch = patches[3]; uv = Vec2f(2.0f*u,2.0f*v-1.0f); dscale *= 2.0f; }
              }
              depth++;
            }
          }